

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

ArchKind __thiscall llvm::ARM::parseCPUArch(ARM *this,StringRef CPU)

{
  int iVar1;
  char *__n;
  long lVar2;
  
  __n = CPU.Data;
  lVar2 = 0x10;
  while( true ) {
    if (lVar2 == 0xa90) {
      return INVALID;
    }
    if ((*(char **)(&UNK_001ca348 + lVar2) == __n) &&
       ((__n == (char *)0x0 ||
        (iVar1 = bcmp(this,*(void **)(&UNK_001ca340 + lVar2),(size_t)__n), iVar1 == 0)))) break;
    lVar2 = lVar2 + 0x20;
  }
  return *(ArchKind *)((long)&(anonymous_namespace)::CPUNames + lVar2);
}

Assistant:

ARM::ArchKind llvm::ARM::parseCPUArch(StringRef CPU) {
  for (const auto C : CPUNames) {
    if (CPU == C.getName())
      return C.ArchID;
  }
  return ARM::ArchKind::INVALID;
}